

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

ostream * Indexing::operator<<
                    (ostream *out,
                    SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *self)

{
  ostream *in_RSI;
  ostream *in_RDI;
  Node *in_stack_ffffffffffffffe8;
  
  if (*(long *)(in_RSI + 8) == 0) {
    std::operator<<(in_RDI,"<empty tree>");
  }
  else {
    operator<<(in_RSI,in_stack_ffffffffffffffe8);
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& out, SubstitutionTree<LeafData_> const& self)
  {
#if VERBOSE_OUTPUT_OPERATORS
    out << "{ nextVar: S" << self._nextVar << ", root: (";
#endif // VERBOSE_OUTPUT_OPERATORS
    if (self._root) {
      out << *self._root;
    } else {
      out << "<empty tree>";
    }
#if VERBOSE_OUTPUT_OPERATORS
    out << ") }";
#endif // VERBOSE_OUTPUT_OPERATORS
    return out;
  }